

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm7tdmi.c
# Opt level: O1

void handle_irq(arm7tdmi_t *state)

{
  uint uVar1;
  status_register_t *psVar2;
  
  if (gba_log_verbosity != 0) {
    printf("\x1b[0;33m[WARN]  IRQ!\n\x1b[0;m");
  }
  uVar1 = (state->cpsr).raw;
  state->halt = false;
  (state->cpsr).raw = uVar1 & 0xffffffe0 | 0x12;
  psVar2 = get_spsr(state);
  psVar2->raw = uVar1;
  (state->cpsr).raw = (state->cpsr).raw & 0xffffff5f | 0x80;
  state->lr_irq = (uVar1 >> 4 & 2) + state->pc;
  state->pc = 0x18;
  fill_pipe(state);
  return;
}

Assistant:

void handle_irq(arm7tdmi_t* state) {
    logwarn("IRQ!")
    status_register_t cpsr = state->cpsr;
    state->halt = false;
    state->cpsr.mode = MODE_IRQ;
    set_spsr(state, cpsr.raw);
    state->cpsr.thumb = 0;
    state->cpsr.disable_irq = 1;
    state->lr_irq = state->pc - (cpsr.thumb ? 2 : 4) + 4;
    set_pc(state, 0x18); // IRQ handler
}